

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# version_edit.h
# Opt level: O3

void __thiscall leveldb::VersionEdit::VersionEdit(VersionEdit *this)

{
  _Rb_tree_header *p_Var1;
  long lVar2;
  long in_FS_OFFSET;
  
  lVar2 = *(long *)(in_FS_OFFSET + 0x28);
  (this->comparator_)._M_dataplus._M_p = (pointer)&(this->comparator_).field_2;
  (this->comparator_)._M_string_length = 0;
  (this->comparator_).field_2._M_local_buf[0] = '\0';
  (this->compact_pointers_).
  super__Vector_base<std::pair<int,_leveldb::InternalKey>,_std::allocator<std::pair<int,_leveldb::InternalKey>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->compact_pointers_).
  super__Vector_base<std::pair<int,_leveldb::InternalKey>,_std::allocator<std::pair<int,_leveldb::InternalKey>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->compact_pointers_).
  super__Vector_base<std::pair<int,_leveldb::InternalKey>,_std::allocator<std::pair<int,_leveldb::InternalKey>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  p_Var1 = &(this->deleted_files_)._M_t._M_impl.super__Rb_tree_header;
  (this->deleted_files_)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->deleted_files_)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->deleted_files_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->deleted_files_)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->deleted_files_)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  (this->new_files_).
  super__Vector_base<std::pair<int,_leveldb::FileMetaData>,_std::allocator<std::pair<int,_leveldb::FileMetaData>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->new_files_).
  super__Vector_base<std::pair<int,_leveldb::FileMetaData>,_std::allocator<std::pair<int,_leveldb::FileMetaData>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->new_files_).
  super__Vector_base<std::pair<int,_leveldb::FileMetaData>,_std::allocator<std::pair<int,_leveldb::FileMetaData>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  Clear(this);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar2) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

VersionEdit() { Clear(); }